

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_softmax_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::FastSoftmaxTest_DISABLED_Speed_Test::~FastSoftmaxTest_DISABLED_Speed_Test
          (FastSoftmaxTest_DISABLED_Speed_Test *this)

{
  FastSoftmaxTest_DISABLED_Speed_Test *in_stack_00000010;
  
  anon_unknown.dwarf_f78a48::FastSoftmaxTest_DISABLED_Speed_Test::
  ~FastSoftmaxTest_DISABLED_Speed_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(FastSoftmaxTest, DISABLED_Speed) {
  constexpr int kNumTimes = 1000000;
  RunSoftmaxSpeedTest(kNumTimes);
}